

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Matchers::Generic::PredicateMatcher<duckdb_interval>::describe_abi_cxx11_
          (string *__return_storage_ptr__,PredicateMatcher<duckdb_interval> *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_description);
  return __return_storage_ptr__;
}

Assistant:

std::string describe() const override {
        return m_description;
    }